

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalGenerator::CreateGeneratorTargets(cmGlobalGenerator *this,TargetTypes targetTypes)

{
  pointer ppcVar1;
  cmMakefile *pcVar2;
  pointer ppcVar3;
  cmTarget *t;
  cmLocalGenerator *lg;
  pointer ppcVar4;
  cmGeneratorTarget *this_00;
  mapped_type *ppcVar5;
  uint uVar6;
  ulong uVar7;
  cmGlobalGenerator *this_01;
  pointer ppcVar8;
  cmTarget *ownedImpTgt;
  map<cmTarget_*,_cmGeneratorTarget_*,_std::less<cmTarget_*>,_std::allocator<std::pair<cmTarget_*const,_cmGeneratorTarget_*>_>_>
  importedMap;
  cmTarget *local_68;
  undefined1 local_60 [16];
  _Alloc_hider local_50;
  _Base_ptr local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_48 = (_Base_ptr)(local_60 + 8);
  local_60._8_4_ = _S_red;
  local_50._M_p = (pointer)0x0;
  local_40._8_8_ = 0;
  uVar6 = 0;
  this_01 = this;
  local_40._M_allocated_capacity = (size_type)local_48;
  while( true ) {
    uVar7 = (ulong)uVar6;
    ppcVar1 = (this->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->Makefiles).
                      super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppcVar1 >> 3) <= uVar7) break;
    pcVar2 = ppcVar1[uVar7];
    ppcVar3 = *(pointer *)
               ((long)&(pcVar2->ImportedTargetsOwned).
                       super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl + 8);
    for (ppcVar8 = (pcVar2->ImportedTargetsOwned).
                   super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
                   super__Vector_impl_data._M_start; ppcVar8 != ppcVar3; ppcVar8 = ppcVar8 + 1) {
      t = *ppcVar8;
      lg = (this->LocalGenerators).
           super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
           super__Vector_impl_data._M_start[uVar7];
      local_68 = t;
      this_00 = (cmGeneratorTarget *)operator_new(0x5a8);
      cmGeneratorTarget::cmGeneratorTarget(this_00,t,lg);
      cmLocalGenerator::AddOwnedImportedGeneratorTarget(lg,this_00);
      this_01 = (cmGlobalGenerator *)local_60;
      ppcVar5 = std::
                map<cmTarget_*,_cmGeneratorTarget_*,_std::less<cmTarget_*>,_std::allocator<std::pair<cmTarget_*const,_cmGeneratorTarget_*>_>_>
                ::operator[]((map<cmTarget_*,_cmGeneratorTarget_*,_std::less<cmTarget_*>,_std::allocator<std::pair<cmTarget_*const,_cmGeneratorTarget_*>_>_>
                              *)this_01,&local_68);
      *ppcVar5 = this_00;
    }
    uVar6 = uVar6 + 1;
  }
  uVar6 = 0;
  while( true ) {
    uVar7 = (ulong)uVar6;
    ppcVar4 = (this->LocalGenerators).
              super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->LocalGenerators).
                      super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)ppcVar4 >> 3) <= uVar7)
    break;
    CreateGeneratorTargets
              (this_01,targetTypes,
               (this->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar7],ppcVar4[uVar7],
               (map<cmTarget_*,_cmGeneratorTarget_*,_std::less<cmTarget_*>,_std::allocator<std::pair<cmTarget_*const,_cmGeneratorTarget_*>_>_>
                *)local_60);
    uVar6 = uVar6 + 1;
  }
  std::
  _Rb_tree<cmTarget_*,_std::pair<cmTarget_*const,_cmGeneratorTarget_*>,_std::_Select1st<std::pair<cmTarget_*const,_cmGeneratorTarget_*>_>,_std::less<cmTarget_*>,_std::allocator<std::pair<cmTarget_*const,_cmGeneratorTarget_*>_>_>
  ::~_Rb_tree((_Rb_tree<cmTarget_*,_std::pair<cmTarget_*const,_cmGeneratorTarget_*>,_std::_Select1st<std::pair<cmTarget_*const,_cmGeneratorTarget_*>_>,_std::less<cmTarget_*>,_std::allocator<std::pair<cmTarget_*const,_cmGeneratorTarget_*>_>_>
               *)local_60);
  return;
}

Assistant:

void cmGlobalGenerator::CreateGeneratorTargets(TargetTypes targetTypes)
{
  std::map<cmTarget*, cmGeneratorTarget*> importedMap;
  for (unsigned int i = 0; i < this->Makefiles.size(); ++i) {
    cmMakefile* mf = this->Makefiles[i];
    for (cmTarget* ownedImpTgt : mf->GetOwnedImportedTargets()) {
      cmLocalGenerator* lg = this->LocalGenerators[i];
      cmGeneratorTarget* gt = new cmGeneratorTarget(ownedImpTgt, lg);
      lg->AddOwnedImportedGeneratorTarget(gt);
      importedMap[ownedImpTgt] = gt;
    }
  }

  // Construct per-target generator information.
  for (unsigned int i = 0; i < this->LocalGenerators.size(); ++i) {
    this->CreateGeneratorTargets(targetTypes, this->Makefiles[i],
                                 this->LocalGenerators[i], importedMap);
  }
}